

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collide_device.cpp
# Opt level: O3

uint embree::createTriangulatedSphere(RTCScene scene,Vec3fa *p,float r)

{
  float fVar1;
  pointer pVVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  Mesh *pMVar6;
  undefined8 uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_> *pvVar17;
  vector<Triangle,_std::allocator<Triangle>_> *this;
  long lVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 in_XMM1 [16];
  undefined1 auVar24 [12];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  _Head_base<0UL,_embree::collide2::Mesh_*,_false> local_60;
  float local_58;
  float local_54;
  vector<Triangle,_std::allocator<Triangle>_> *local_50;
  vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_> *local_48;
  RTCScene local_40;
  ulong local_38;
  
  auVar24 = in_XMM1._4_12_;
  pMVar6 = (Mesh *)operator_new(0x38);
  pMVar6->_vptr_Mesh = (_func_int **)&PTR__Mesh_002cac10;
  local_48 = &pMVar6->x_;
  (pMVar6->x_).super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pMVar6->x_).super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pMVar6->x_).super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pMVar6->tris_).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pMVar6->tris_).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pMVar6->tris_).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60._M_head_impl = pMVar6;
  std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::resize
            (local_48,((long)numPhi + -1) * (long)(int)numTheta + 2);
  this = &pMVar6->tris_;
  std::vector<Triangle,_std::allocator<Triangle>_>::resize
            (this,((long)numPhi + -1) * (long)(int)numTheta * 2);
  auVar23._0_4_ = (float)(int)numTheta;
  auVar23._4_12_ = auVar24;
  fVar19 = (float)numPhi;
  (((local_48->super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>)._M_impl.
    super__Vector_impl_data._M_start)->field_0).m128[0] = (p->field_0).m128[0];
  (((local_48->super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>)._M_impl.
    super__Vector_impl_data._M_start)->field_0).m128[1] = (p->field_0).m128[1] + r;
  (((local_48->super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>)._M_impl.
    super__Vector_impl_data._M_start)->field_0).m128[2] = (p->field_0).m128[2];
  pvVar17 = local_48;
  local_50 = this;
  local_40 = scene;
  if (numPhi < 2) {
    iVar8 = numPhi + -1;
  }
  else {
    auVar25._4_4_ = auVar24._0_4_;
    auVar25._0_4_ = auVar23._0_4_;
    auVar25._8_4_ = auVar24._4_4_;
    auVar25._12_4_ = auVar24._8_4_;
    auVar25 = rcpss(auVar25,auVar23);
    local_54 = (2.0 - auVar23._0_4_ * auVar25._0_4_) * auVar25._0_4_;
    auVar23 = rcpss(ZEXT416((uint)fVar19),ZEXT416((uint)fVar19));
    local_58 = (2.0 - fVar19 * auVar23._0_4_) * auVar23._0_4_;
    local_38 = 0;
    do {
      iVar8 = (int)local_38;
      uVar4 = iVar8 + 1;
      local_38 = (ulong)uVar4;
      fVar19 = (float)(int)uVar4 * 3.1415927 * local_58;
      fVar20 = sinf(fVar19);
      fVar19 = cosf(fVar19);
      if (0 < (int)numTheta) {
        lVar18 = 0;
        do {
          fVar21 = ((float)(int)lVar18 + (float)(int)lVar18) * 3.1415927 * local_54;
          pVVar2 = (pvVar17->super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          lVar15 = (int)(numTheta * iVar8) + lVar18;
          fVar1 = (p->field_0).m128[0];
          fVar22 = sinf(fVar21);
          pVVar2[lVar15 + 1].field_0.m128[0] = fVar22 * fVar20 * r + fVar1;
          pVVar2[lVar15 + 1].field_0.m128[1] = (p->field_0).m128[1] + fVar19 * r;
          fVar1 = (p->field_0).m128[2];
          fVar21 = cosf(fVar21);
          pVVar2[lVar15 + 1].field_0.m128[2] = fVar21 * fVar20 * r + fVar1;
          lVar18 = lVar18 + 1;
          pvVar17 = local_48;
        } while ((int)lVar18 < (int)numTheta);
      }
      iVar8 = numPhi + -1;
    } while ((int)local_38 < iVar8);
  }
  (pvVar17->super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>)._M_impl.
  super__Vector_impl_data._M_start[(long)(int)(numTheta * iVar8) + 1].field_0.m128[0] =
       (p->field_0).m128[0];
  (pvVar17->super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>)._M_impl.
  super__Vector_impl_data._M_start[((long)numPhi + -1) * (long)(int)numTheta + 1].field_0.m128[1] =
       (p->field_0).m128[1] - r;
  (pvVar17->super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>)._M_impl.
  super__Vector_impl_data._M_start[((long)numPhi + -1) * (long)(int)numTheta + 1].field_0.m128[2] =
       (p->field_0).m128[2];
  uVar11 = (ulong)numTheta;
  if ((int)numTheta < 1) {
    uVar9 = 0;
  }
  else {
    lVar18 = 0;
    uVar9 = 0;
    do {
      uVar9 = uVar9 + 1;
      *(int *)((long)&((local_50->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
                       super__Vector_impl_data._M_start)->v0 + lVar18) = (int)uVar9;
      *(undefined4 *)
       ((long)&((local_50->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
                super__Vector_impl_data._M_start)->v1 + lVar18) = 0;
      *(int *)((long)&((local_50->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
                       super__Vector_impl_data._M_start)->v2 + lVar18) =
           (int)((long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) %
                (long)(int)numTheta) + 1;
      uVar11 = (ulong)(int)numTheta;
      lVar18 = lVar18 + 0xc;
    } while ((long)uVar9 < (long)uVar11);
  }
  iVar8 = (int)uVar9;
  if (2 < numPhi) {
    iVar12 = 1;
    iVar5 = numPhi;
    iVar14 = 0;
    do {
      iVar13 = iVar14 + 1;
      if (0 < (int)uVar11) {
        lVar18 = (long)(int)uVar9 * 0xc;
        iVar8 = 1;
        do {
          iVar10 = (int)uVar11;
          iVar5 = iVar10 * iVar14 + iVar8 % iVar10 + 1;
          iVar16 = iVar12 * iVar10 + iVar8;
          *(int *)((long)&((pMVar6->tris_).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                           _M_impl.super__Vector_impl_data._M_start)->v0 + lVar18) = iVar16;
          *(int *)((long)&((pMVar6->tris_).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                           _M_impl.super__Vector_impl_data._M_start)->v1 + lVar18) = iVar5;
          *(int *)((long)&((pMVar6->tris_).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                           _M_impl.super__Vector_impl_data._M_start)->v2 + lVar18) =
               iVar8 + iVar10 * iVar14;
          *(int *)((long)&(pMVar6->tris_).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                          _M_impl.super__Vector_impl_data._M_start[1].v0 + lVar18) =
               iVar8 % iVar10 + iVar10 * iVar13 + 1;
          *(int *)((long)&(pMVar6->tris_).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                          _M_impl.super__Vector_impl_data._M_start[1].v1 + lVar18) = iVar5;
          *(int *)((long)&(pMVar6->tris_).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                          _M_impl.super__Vector_impl_data._M_start[1].v2 + lVar18) = iVar16;
          uVar11 = (ulong)numTheta;
          lVar18 = lVar18 + 0x18;
          uVar9 = (ulong)((int)uVar9 + 2);
          bVar3 = iVar8 < (int)numTheta;
          iVar5 = numPhi;
          iVar8 = iVar8 + 1;
        } while (bVar3);
      }
      iVar8 = (int)uVar9;
      iVar12 = iVar12 + 1;
      iVar14 = iVar13;
    } while (iVar13 < iVar5 + -2);
  }
  if (0 < (int)uVar11) {
    lVar18 = (long)iVar8 * 0xc;
    iVar8 = 1;
    do {
      *(int *)((long)&((local_50->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
                       super__Vector_impl_data._M_start)->v0 + lVar18) =
           (numPhi + -2) * (int)uVar11 + iVar8 % (int)uVar11 + 1;
      *(uint *)((long)&((local_50->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
                        super__Vector_impl_data._M_start)->v1 + lVar18) =
           (numPhi + -1) * numTheta + 1;
      *(uint *)((long)&((local_50->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
                        super__Vector_impl_data._M_start)->v2 + lVar18) =
           (numPhi + -2) * numTheta + iVar8;
      uVar11 = (ulong)numTheta;
      lVar18 = lVar18 + 0xc;
      bVar3 = iVar8 < (int)numTheta;
      iVar8 = iVar8 + 1;
    } while (bVar3);
  }
  uVar7 = rtcNewGeometry(g_device,0x78);
  uVar4 = rtcAttachGeometry(local_40,uVar7);
  rtcSetGeometryUserPrimitiveCount
            (uVar7,(int)((ulong)((long)(pMVar6->tris_).
                                       super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)(pMVar6->tris_).
                                      super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555)
  ;
  rtcSetGeometryUserData(uVar7,uVar4);
  rtcSetGeometryBoundsFunction(uVar7,triangle_bounds_func,0);
  rtcSetGeometryIntersectFunction(uVar7,triangle_intersect_func);
  rtcCommitGeometry(uVar7);
  rtcReleaseGeometry(uVar7);
  std::
  vector<std::unique_ptr<embree::collide2::Mesh,std::default_delete<embree::collide2::Mesh>>,std::allocator<std::unique_ptr<embree::collide2::Mesh,std::default_delete<embree::collide2::Mesh>>>>
  ::
  emplace_back<std::unique_ptr<embree::collide2::Mesh,std::default_delete<embree::collide2::Mesh>>>
            ((vector<std::unique_ptr<embree::collide2::Mesh,std::default_delete<embree::collide2::Mesh>>,std::allocator<std::unique_ptr<embree::collide2::Mesh,std::default_delete<embree::collide2::Mesh>>>>
              *)&meshes,
             (unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_> *)
             &local_60);
  if (local_60._M_head_impl != (Mesh *)0x0) {
    (*(local_60._M_head_impl)->_vptr_Mesh[1])();
  }
  return uVar4;
}

Assistant:

unsigned int createTriangulatedSphere (RTCScene scene, const Vec3fa& p, float r)
{
  /* create triangle mesh */
  std::unique_ptr<collide2::Mesh> sphere (new collide2::Mesh());
  sphere->x_.resize (numTheta*(numPhi-1)+2);
  sphere->tris_.resize (2*numTheta*(numPhi-1));

  /* create sphere */
  int tri = 0;
  const float rcpNumTheta = rcp((float)numTheta);
  const float rcpNumPhi   = rcp((float)numPhi);
  sphere->x_[0].x = p.x;
  sphere->x_[0].y = p.y + r;
  sphere->x_[0].z = p.z;

  for (int phi=0; phi<numPhi-1; phi++)
  {
    const float phif   = (phi+1)*float(pi)*rcpNumPhi;
    const float sinp   = sin(phif);
    const float cosp   = cos(phif);
    for (int theta=0; theta<numTheta; theta++)
    {
      const float thetaf = theta*2.0f*float(pi)*rcpNumTheta;

      auto& v = sphere->x_[phi*(numTheta)+theta+1];
      v.x = p.x + r*sinp*sin(thetaf);
      v.y = p.y + r*cosp;
      v.z = p.z + r*sinp*cos(thetaf);
    }
  }
  sphere->x_[numTheta*(numPhi-1)+1].x = p.x;
  sphere->x_[numTheta*(numPhi-1)+1].y = p.y - r;
  sphere->x_[numTheta*(numPhi-1)+1].z = p.z;

  for (int theta=0; theta<numTheta; theta++) {
    sphere->tris_[tri].v0 = theta+1;
    sphere->tris_[tri].v1 = 0;
    sphere->tris_[theta].v2 = (theta+1)%numTheta + 1;
    tri++;
  }

  for (int phi=0; phi<numPhi-2; phi++)
  {
    for (int theta=0; theta<numTheta; theta++)
    {
      int p00 = phi*numTheta + 1 + theta;
      int p01 = phi*numTheta + 1 + (theta+1)%numTheta;
      int p10 = (phi+1)*numTheta + 1 + theta;
      int p11 = (phi+1)*numTheta + 1 + (theta+1)%numTheta;

      sphere->tris_[tri].v0 = p10;
      sphere->tris_[tri].v1 = p01;
      sphere->tris_[tri].v2 = p00;
      tri++;

      sphere->tris_[tri].v0 = p11;
      sphere->tris_[tri].v1 = p01;
      sphere->tris_[tri].v2 = p10;
      tri++;
    }
  }

  for (int theta=0; theta<numTheta; theta++) {
    sphere->tris_[tri].v0 = (theta+1)%numTheta + numTheta*(numPhi-2) + 1;
    sphere->tris_[tri].v1 = numTheta*(numPhi-1)+1;
    sphere->tris_[tri].v2 = theta + numTheta*(numPhi-2) + 1;
    tri++;
  }

  // if (use_user_geometry) {
    RTCGeometry geom = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_USER);
    unsigned int geomID = rtcAttachGeometry(scene,geom);
    rtcSetGeometryUserPrimitiveCount(geom, sphere->tris_.size());
    rtcSetGeometryUserData(geom,(void*)(size_t)geomID);
    rtcSetGeometryBoundsFunction   (geom, triangle_bounds_func, nullptr);
    rtcSetGeometryIntersectFunction(geom, triangle_intersect_func);
    rtcCommitGeometry(geom);
    rtcReleaseGeometry(geom);
    meshes.push_back (std::move (sphere));
    return geomID;
  // } else {
  //   RTCGeometry geom = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_TRIANGLE);
  //   rtcSetSharedGeometryBuffer(geom,RTC_BUFFER_TYPE_VERTEX,0,RTC_FORMAT_FLOAT3,sphere->x_.data(),0,sizeof(collide2::vec_t),sphere->x_.size());
  //   rtcSetSharedGeometryBuffer(geom,RTC_BUFFER_TYPE_INDEX,0,RTC_FORMAT_UINT3,sphere->tris_.data(),0,sizeof(Triangle),sphere->tris_.size ());
  //   rtcCommitGeometry(geom);
  //   unsigned int geomID = rtcAttachGeometry(scene,geom);
  //   rtcReleaseGeometry(geom);
  //   meshes.push_back (std::move (sphere));
  //   return geomID;
  // }
}